

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
::AddAllUnbridged(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
                  *this,BasicFlatModelAPI *be,ItemNamer *vnam)

{
  uint uVar1;
  _Map_pointer ppCVar2;
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  LinkEntry be_00;
  int iVar7;
  reference cnt;
  ValueNode *pVVar8;
  int iVar9;
  uint uVar10;
  
  iVar7 = this->i_2add_next_;
  while (ppCVar2 = (this->cons_).
                   super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
        iVar7 < (int)((int)((ulong)((long)(this->cons_).
                                          super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                                   (long)(this->cons_).
                                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
                      -0x45d1745d +
                     (int)((ulong)((long)(this->cons_).
                                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                  (long)(this->cons_).
                                        super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
                     -0x45d1745d +
                     ((int)((ulong)((long)ppCVar2 -
                                   (long)(this->cons_).
                                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) +
                      -1 + (uint)(ppCVar2 == (_Map_pointer)0x0)) * 5)) {
    cnt = std::
          _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container_*>
          ::operator[](&(this->cons_).
                        super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>::Container>_>
                        ._M_impl.super__Deque_impl_data._M_start,(long)iVar7);
    bVar5 = cnt->is_unused_ == '\0';
    bVar6 = cnt->is_bridged_ == '\0';
    if (bVar5 && bVar6) {
      BasicFlatModelAPI::
      AddConstraint<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::NumberofConstId>>
                (be,(CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
                     *)cnt);
      iVar9 = this->i_2add_next_;
      uVar1 = (uint)(this->super_BasicConstraintKeeper).value_node_.sz_;
      uVar10 = iVar9 >> 0x1f & uVar1;
      iVar7 = uVar10 + iVar9;
      iVar9 = iVar9 + uVar10 + 1;
      if ((int)uVar1 <= iVar7) {
        (this->super_BasicConstraintKeeper).value_node_.sz_ = (long)iVar9;
      }
      pFVar3 = this->cvt_;
      be_00.first.ir_.end_ = iVar9;
      be_00.first.ir_.beg_ = iVar7;
      pVVar8 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                         (&(pFVar3->
                           super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ).value_presolver_.super_ValuePresolverImpl.dest_.cons_,0);
      uVar4 = pVVar8->sz_;
      pVVar8->sz_ = uVar4 + 1;
      be_00.first.pvn_ = &(this->super_BasicConstraintKeeper).value_node_;
      be_00.second.pvn_ = pVVar8;
      be_00.second.ir_ = (NodeIndexRange)((uVar4 & 0xffffffff | uVar4 << 0x20) + 0x100000000);
      pre::CopyLink::AddEntry
                (&(pFVar3->
                  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ).copy_link_,be_00);
    }
    ExportConStatus(this,this->i_2add_next_,cnt,vnam,bVar5 && bVar6);
    iVar7 = this->i_2add_next_ + 1;
    this->i_2add_next_ = iVar7;
  }
  return;
}

Assistant:

void AddAllUnbridged(BasicFlatModelAPI& be,
                       ItemNamer& vnam) {
    auto con_group = GetConstraintGroup(be);
		for ( ; i_2add_next_ < (int)cons_.size(); ++i_2add_next_) {
      const auto& cont = cons_[i_2add_next_];
      bool adding = !cont.IsRedundant();            // includes 'unused'
      if (adding) {
        static_cast<Backend&>(be).AddConstraint(cont.GetCon());
        GetConverter().GetCopyLink().             // Linking to the "final" nodes
            AddEntry({
                       GetValueNode().Select(i_2add_next_),
                       GetConverter().GetValuePresolver().GetTargetNodes().
                         GetConValues()(con_group).Add()
                     });
      }
      ExportConStatus(i_2add_next_, cont, vnam, adding);
    }
  }